

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_to_storage(secp256k1_ge_storage *r,secp256k1_ge *a)

{
  undefined1 local_68 [8];
  secp256k1_fe y;
  secp256k1_fe x;
  secp256k1_ge *a_local;
  secp256k1_ge_storage *r_local;
  
  memcpy(y.n + 8,a,0x28);
  secp256k1_fe_normalize((secp256k1_fe *)(y.n + 8));
  memcpy(local_68,&a->y,0x28);
  secp256k1_fe_normalize((secp256k1_fe *)local_68);
  secp256k1_fe_to_storage(&r->x,(secp256k1_fe *)(y.n + 8));
  secp256k1_fe_to_storage(&r->y,(secp256k1_fe *)local_68);
  return;
}

Assistant:

static void secp256k1_ge_to_storage(secp256k1_ge_storage *r, const secp256k1_ge *a) {
    secp256k1_fe x, y;
    VERIFY_CHECK(!a->infinity);
    x = a->x;
    secp256k1_fe_normalize(&x);
    y = a->y;
    secp256k1_fe_normalize(&y);
    secp256k1_fe_to_storage(&r->x, &x);
    secp256k1_fe_to_storage(&r->y, &y);
}